

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

float __thiscall nv::FloatImage::sampleLinearMirror(FloatImage *this,float x,float y,int c)

{
  uint w_00;
  int iVar1;
  uint x_00;
  uint y_00;
  uint x_01;
  uint y_01;
  uint w_01;
  float fVar2;
  float fVar3;
  float t;
  float t_00;
  float f0;
  float f1_00;
  float i2;
  float i1;
  float f4;
  float f3;
  float f2;
  float f1;
  int iy1;
  int ix1;
  int iy0;
  int ix0;
  float fracY;
  float fracX;
  int h;
  int w;
  int c_local;
  float y_local;
  float x_local;
  FloatImage *this_local;
  
  w_01 = (uint)this->m_width;
  w_00 = (uint)this->m_height;
  fVar2 = (float)w_01 * x;
  fVar3 = (float)w_00 * y;
  t = anon_unknown.dwarf_46676e::frac(fVar2);
  t_00 = anon_unknown.dwarf_46676e::frac(fVar3);
  iVar1 = anon_unknown.dwarf_46676e::iround(fVar2);
  x_00 = anon_unknown.dwarf_46676e::mirror(iVar1,w_01);
  iVar1 = anon_unknown.dwarf_46676e::iround(fVar3);
  y_00 = anon_unknown.dwarf_46676e::mirror(iVar1,w_00);
  iVar1 = anon_unknown.dwarf_46676e::iround(fVar2);
  x_01 = anon_unknown.dwarf_46676e::mirror(iVar1 + 1,w_01);
  iVar1 = anon_unknown.dwarf_46676e::iround(fVar3);
  y_01 = anon_unknown.dwarf_46676e::mirror(iVar1 + 1,w_00);
  fVar2 = pixel(this,x_00,y_00,c);
  fVar3 = pixel(this,x_01,y_00,c);
  f0 = pixel(this,x_00,y_01,c);
  f1_00 = pixel(this,x_01,y_01,c);
  fVar2 = lerp(fVar2,fVar3,t);
  fVar3 = lerp(f0,f1_00,t);
  fVar2 = lerp(fVar2,fVar3,t_00);
  return fVar2;
}

Assistant:

float FloatImage::sampleLinearMirror(float x, float y, int c) const
{
	const int w = m_width;
	const int h = m_height;

	x *= w;
	y *= h;

	const float fracX = frac(x);
	const float fracY = frac(y);

	int ix0 = mirror(iround(x), w);
	int iy0 = mirror(iround(y), h);
	int ix1 = mirror(iround(x) + 1, w);
	int iy1 = mirror(iround(y) + 1, h);

	float f1 = pixel(ix0, iy0, c);
	float f2 = pixel(ix1, iy0, c);
	float f3 = pixel(ix0, iy1, c);
	float f4 = pixel(ix1, iy1, c);
	
	float i1 = lerp(f1, f2, fracX);
	float i2 = lerp(f3, f4, fracX);

	return lerp(i1, i2, fracY);
}